

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

size_t ExtensionObject_calcSizeBinary(UA_ExtensionObject *src,UA_DataType *_)

{
  UA_ExtensionObjectEncoding UVar1;
  UA_DataType *pUVar2;
  void *pvVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  
  UVar1 = src->encoding;
  if (UVar1 < UA_EXTENSIONOBJECT_DECODED) {
    sVar4 = NodeId_calcSizeBinary(&(src->content).encoded.typeId,_);
    if (UVar1 == UA_EXTENSIONOBJECT_ENCODED_NOBODY) {
      sVar4 = sVar4 + 1;
    }
    else {
      sVar4 = sVar4 + (src->content).encoded.body.length + 5;
    }
  }
  else {
    pUVar2 = (src->content).decoded.type;
    if (((pUVar2 == (UA_DataType *)0x0) ||
        (pvVar3 = (src->content).decoded.data, pvVar3 == (void *)0x0)) ||
       ((pUVar2->typeId).identifierType != UA_NODEIDTYPE_NUMERIC)) {
      sVar4 = 0;
    }
    else {
      sVar4 = NodeId_calcSizeBinary(&pUVar2->typeId,_);
      if ((pUVar2->field_0x25 & 1) == 0) {
        uVar5 = 0x19;
      }
      else {
        uVar5 = (ulong)pUVar2->typeIndex;
      }
      lVar6 = (*(code *)(&calcSizeBinaryJumpTable)[uVar5])(pvVar3,pUVar2);
      sVar4 = sVar4 + 5 + lVar6;
    }
  }
  return sVar4;
}

Assistant:

static size_t
ExtensionObject_calcSizeBinary(const UA_ExtensionObject *src, UA_DataType *_) {
    size_t s = 1; // encoding byte
    if(src->encoding > UA_EXTENSIONOBJECT_ENCODED_XML) {
        if(!src->content.decoded.type || !src->content.decoded.data)
            return 0;
        if(src->content.decoded.type->typeId.identifierType != UA_NODEIDTYPE_NUMERIC)
            return 0;
        s += NodeId_calcSizeBinary(&src->content.decoded.type->typeId, NULL);
        s += 4; // length
        const UA_DataType *type = src->content.decoded.type;
        size_t encode_index = type->builtin ? type->typeIndex : UA_BUILTIN_TYPES_COUNT;
        s += calcSizeBinaryJumpTable[encode_index](src->content.decoded.data, type);
    } else {
        s += NodeId_calcSizeBinary(&src->content.encoded.typeId, NULL);
        switch (src->encoding) {
        case UA_EXTENSIONOBJECT_ENCODED_NOBODY:
            break;
        case UA_EXTENSIONOBJECT_ENCODED_BYTESTRING:
        case UA_EXTENSIONOBJECT_ENCODED_XML:
            s += String_calcSizeBinary(&src->content.encoded.body, NULL);
            break;
        default:
            return 0;
        }
    }
    return s;
}